

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ParseReservedNames
          (Parser *this,DescriptorProto *message,LocationRecorder *parent_location)

{
  Location *parent;
  bool bVar1;
  int path1;
  string *output;
  undefined1 local_40 [8];
  LocationRecorder location;
  LocationRecorder *parent_location_local;
  DescriptorProto *message_local;
  Parser *this_local;
  
  location.location_ = (Location *)parent_location;
  do {
    parent = location.location_;
    path1 = DescriptorProto::reserved_name_size(message);
    LocationRecorder::LocationRecorder
              ((LocationRecorder *)local_40,(LocationRecorder *)parent,path1);
    output = DescriptorProto::add_reserved_name_abi_cxx11_(message);
    bVar1 = ConsumeString(this,output,"Expected field name.");
    if (!bVar1) {
      this_local._7_1_ = 0;
    }
    LocationRecorder::~LocationRecorder((LocationRecorder *)local_40);
    if (!bVar1) goto LAB_00638a5e;
    bVar1 = TryConsume(this,",");
  } while (bVar1);
  bVar1 = ConsumeEndOfDeclaration(this,";",(LocationRecorder *)location.location_);
  if (bVar1) {
    this_local._7_1_ = 1;
  }
  else {
    this_local._7_1_ = 0;
  }
LAB_00638a5e:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Parser::ParseReservedNames(DescriptorProto* message,
                                const LocationRecorder& parent_location) {
  do {
    LocationRecorder location(parent_location, message->reserved_name_size());
    DO(ConsumeString(message->add_reserved_name(), "Expected field name."));
  } while (TryConsume(","));
  DO(ConsumeEndOfDeclaration(";", &parent_location));
  return true;
}